

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XMLReader::getQName(XMLReader *this,XMLBuffer *toFill,int *colonPosition)

{
  bool bVar1;
  XMLSize_t XVar2;
  int *colonPosition_local;
  XMLBuffer *toFill_local;
  XMLReader *this_local;
  
  bVar1 = getNCName(this,toFill);
  if (bVar1) {
    if ((this->fCharIndex == this->fCharsAvail) && (bVar1 = refreshCharBuffer(this), !bVar1)) {
      *colonPosition = -1;
      return true;
    }
    if (this->fCharBuf[this->fCharIndex] == L':') {
      XVar2 = XMLBuffer::getLen(toFill);
      *colonPosition = (int)XVar2;
      XMLBuffer::append(toFill,L':');
      this->fCharIndex = this->fCharIndex + 1;
      this->fCurCol = this->fCurCol + 1;
      this_local._7_1_ = getNCName(this,toFill);
    }
    else {
      *colonPosition = -1;
      this_local._7_1_ = true;
    }
  }
  else {
    *colonPosition = -1;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool XMLReader::getQName(XMLBuffer& toFill, int* colonPosition)
{
    // We are only looking for two iterations (i.e. 'NCNAME':'NCNAME').
    // We will stop when we finished scanning for a QName (i.e. either a second
    // colon or an invalid char).
    if(!getNCName(toFill))
    {
        *colonPosition = -1;
        return false;
    }
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
    {
        *colonPosition = -1;
        return true;
    }
    if (fCharBuf[fCharIndex] != chColon)
    {
        *colonPosition = -1;
        return true;
    }

    *colonPosition = (int)toFill.getLen();
    toFill.append(chColon);
    fCharIndex++;
    fCurCol++;
    return getNCName(toFill);
}